

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4random.c
# Opt level: O2

void arc4_addrandom(uchar *dat,int datlen)

{
  uchar uVar1;
  int iVar2;
  
  for (iVar2 = 0; iVar2 != 0x100; iVar2 = iVar2 + 1) {
    uVar1 = rs.s[rs.i];
    rs.j = rs.j + uVar1 + dat[(long)iVar2 % (long)datlen & 0xffffffff];
    rs.s[rs.i] = rs.s[rs.j];
    rs.s[rs.j] = uVar1;
    rs.i = rs.i + 1;
  }
  rs.i = rs.i - 1;
  rs.j = rs.i;
  return;
}

Assistant:

static inline void
arc4_addrandom(const unsigned char *dat, int datlen)
{
	int     n;
	unsigned char si;

	rs.i--;
	for (n = 0; n < 256; n++) {
		rs.i = (rs.i + 1);
		si = rs.s[rs.i];
		rs.j = (rs.j + si + dat[n % datlen]);
		rs.s[rs.i] = rs.s[rs.j];
		rs.s[rs.j] = si;
	}
	rs.j = rs.i;
}